

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Literal * __thiscall wasm::Literal::convertSIToF32(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  float fVar2;
  
  uVar1 = (this->type).id;
  if (uVar1 == 3) {
    fVar2 = (float)(this->field_0).i64;
  }
  else {
    if (uVar1 != 2) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x2d7);
    }
    fVar2 = (float)(this->field_0).i32;
  }
  *(float *)&__return_storage_ptr__->field_0 = fVar2;
  (__return_storage_ptr__->type).id = 4;
  return __return_storage_ptr__;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }